

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
checkInterfacePropertyCompatibility<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,CompatibleType t,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_6)

{
  pointer pcVar1;
  cmLocalGenerator *localGenerator;
  cmGeneratorTarget *pcVar2;
  char *pcVar3;
  pointer pbVar4;
  int iVar5;
  cmPropertyMap *pcVar6;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var7;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *pvVar8;
  string *psVar9;
  ostream *poVar10;
  size_t sVar11;
  cmGeneratorExpressionInterpreter *pcVar12;
  bool bVar13;
  bool bVar14;
  unique_ptr<cmGeneratorExpressionInterpreter,_std::default_delete<cmGeneratorExpressionInterpreter>_>
  genexInterpreter;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  consistent;
  string report;
  string reportEntry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ifacePropContent;
  ostringstream e;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  string interfaceProperty;
  cmGeneratorExpressionInterpreter *local_3a8;
  undefined1 local_3a0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string local_378;
  cmGeneratorTarget *local_358;
  undefined1 *local_350;
  long local_348;
  undefined1 local_340;
  undefined7 uStack_33f;
  string local_330;
  cmGeneratorExpressionInterpreter *local_310;
  char *local_308;
  size_type local_300;
  char local_2f8;
  undefined7 uStack_2f7;
  undefined8 uStack_2f0;
  string local_2e8;
  _Base_ptr local_2c8;
  _Base_ptr local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b8;
  char *local_2b0;
  size_type local_2a8;
  char local_2a0;
  undefined7 uStack_29f;
  undefined8 uStack_298;
  char *local_290;
  size_type local_288;
  char local_280;
  undefined7 uStack_27f;
  undefined8 uStack_278;
  undefined1 local_270 [17];
  undefined7 uStack_25f;
  undefined8 uStack_258;
  ios_base local_200 [264];
  char *local_f8;
  cmGeneratorExpressionInterpreter *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = defaultValue;
  getTypedProperty<std::__cxx11::string>
            (__return_storage_ptr__,tgt,p,(cmGeneratorExpressionInterpreter *)0x0);
  pcVar6 = cmTarget::GetProperties(tgt->Target);
  cmPropertyMap::GetKeys_abi_cxx11_(&local_a8,pcVar6);
  _Var7 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_a8.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,p);
  bVar13 = _Var7._M_current !=
           local_a8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2c0 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(tgt->LinkImplicitNullProperties)._M_t,p);
  local_2b8 = local_a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_2c8 = &(tgt->LinkImplicitNullProperties)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_2c0 != local_2c8 &&
      _Var7._M_current !=
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorTarget.cxx"
                  ,0x1276,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = std::basic_string<char>]"
                 );
  }
  pvVar8 = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  if ((pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (pvVar8->
      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378," * Target \"","");
    psVar9 = cmTarget::GetName_abi_cxx11_(tgt->Target);
    std::__cxx11::string::_M_append((char *)&local_378,(ulong)(psVar9->_M_dataplus)._M_p);
    local_358 = tgt;
    local_e8 = _Var7._M_current;
    if (_Var7._M_current != local_2b8) {
      std::__cxx11::string::append((char *)&local_378);
      pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_290 = &local_280;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
      if (local_290 == &local_280) {
        uStack_258 = uStack_278;
        local_270._0_8_ = local_270 + 0x10;
      }
      else {
        local_270._0_8_ = local_290;
      }
      uStack_25f = uStack_27f;
      local_270[0x10] = local_280;
      local_270._8_8_ = local_288;
      local_288 = 0;
      local_280 = '\0';
      local_290 = &local_280;
      std::__cxx11::string::_M_append((char *)&local_378,local_270._0_8_);
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
      }
      if (local_290 != &local_280) {
        operator_delete(local_290,CONCAT71(uStack_27f,local_280) + 1);
      }
    }
    pcVar2 = local_358;
    std::__cxx11::string::append((char *)&local_378);
    std::operator+(&local_50,"INTERFACE_",p);
    iVar5 = std::__cxx11::string::compare((char *)p);
    if (iVar5 == 0) {
      local_310 = (cmGeneratorExpressionInterpreter *)operator_new(0x68);
      localGenerator = pcVar2->LocalGenerator;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      pcVar1 = (config->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,pcVar1,pcVar1 + config->_M_string_length);
      pcVar12 = local_310;
      local_70._M_string_length = 0;
      local_70.field_2._M_local_buf[0] = '\0';
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
                (local_310,localGenerator,&local_c8,pcVar2,&local_70);
      local_3a8 = pcVar12;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      local_3a8 = (cmGeneratorExpressionInterpreter *)0x0;
    }
    if ((iVar5 == 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2)) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    pcVar12 = (cmGeneratorExpressionInterpreter *)
              (pvVar8->
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_f0 = (cmGeneratorExpressionInterpreter *)
               (pvVar8->
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    if (pcVar12 != local_f0) {
      do {
        pcVar2 = (cmGeneratorTarget *)
                 (pcVar12->GeneratorExpression).Backtrace.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_310 = pcVar12;
        pcVar6 = cmTarget::GetProperties(pcVar2->Target);
        cmPropertyMap::GetKeys_abi_cxx11_(&local_e0,pcVar6);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                          (local_e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           local_e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        pbVar4 = local_e0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        getTypedProperty<std::__cxx11::string>(&local_2e8,pcVar2,&local_50,local_3a8);
        local_350 = &local_340;
        local_348 = 0;
        local_340 = 0;
        if (_Var7._M_current != pbVar4) {
          std::__cxx11::string::append((char *)&local_350);
          psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
          std::__cxx11::string::_M_append((char *)&local_350,(ulong)(psVar9->_M_dataplus)._M_p);
          std::__cxx11::string::append((char *)&local_350);
          local_308 = &local_2f8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_308,local_2e8._M_dataplus._M_p,
                     local_2e8._M_dataplus._M_p + local_2e8._M_string_length);
          local_270._0_8_ = local_270 + 0x10;
          if (local_308 == &local_2f8) {
            uStack_258 = uStack_2f0;
          }
          else {
            local_270._0_8_ = local_308;
          }
          uStack_25f = uStack_2f7;
          local_270[0x10] = local_2f8;
          local_270._8_8_ = local_300;
          local_300 = 0;
          local_2f8 = '\0';
          local_308 = &local_2f8;
          std::__cxx11::string::_M_append((char *)&local_350,local_270._0_8_);
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
          }
          if (local_308 != &local_2f8) {
            operator_delete(local_308,CONCAT71(uStack_2f7,local_2f8) + 1);
          }
          std::__cxx11::string::append((char *)&local_350);
        }
        if (local_e8 == local_2b8) {
          if (local_2c0 == local_2c8) {
            if (_Var7._M_current == pbVar4) goto LAB_0035874f;
            if (bVar13) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a0,__return_storage_ptr__,&local_2e8,t);
              std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_350);
              sVar11 = __return_storage_ptr__->_M_string_length;
              bVar14 = true;
              if (sVar11 == local_3a0._16_8_) {
                if (sVar11 == 0) {
                  bVar14 = false;
                }
                else {
                  iVar5 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a0._8_8_,
                               sVar11);
                  bVar14 = iVar5 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_270,t,bVar14);
              std::__cxx11::string::_M_append((char *)&local_378,local_270._0_8_);
              if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
                operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
              }
              if (local_3a0[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_270,"The INTERFACE_",0xe);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," property of \"",0xe);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" does\nnot agree with the value of ",0x23);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," already determined\nfor \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(local_358->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_330);
                goto LAB_00358c9e;
              }
              iVar5 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_00358ce4;
            }
            local_270._0_8_ = local_270 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_270,local_350,local_350 + local_348);
            std::__cxx11::string::append((char *)local_270);
            std::__cxx11::string::_M_append((char *)&local_378,local_270._0_8_);
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
            }
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
            iVar5 = 0;
            bVar13 = true;
          }
          else {
            local_90[0] = local_80;
            pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_90,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
            local_270._8_8_ = 0;
            stack0xfffffffffffffda0 = stack0xfffffffffffffda0 & 0xffffffffffffff00;
            local_270._0_8_ = local_270 + 0x10;
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_270);
            if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
              operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
            }
            if (local_90[0] != local_80) {
              operator_delete(local_90[0],local_80[0] + 1);
            }
            if (_Var7._M_current != pbVar4) {
              consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)local_3a0,__return_storage_ptr__,&local_2e8,t);
              std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_350);
              sVar11 = __return_storage_ptr__->_M_string_length;
              bVar14 = true;
              if (sVar11 == local_3a0._16_8_) {
                if (sVar11 == 0) {
                  bVar14 = false;
                }
                else {
                  iVar5 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a0._8_8_,
                               sVar11);
                  bVar14 = iVar5 != 0;
                }
              }
              compatibilityAgree_abi_cxx11_((string *)local_270,t,bVar14);
              std::__cxx11::string::_M_append((char *)&local_378,local_270._0_8_);
              if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
                operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
              }
              if (local_3a0[0] == false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_270,"Property ",9);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_270,(p->_M_dataplus)._M_p,p->_M_string_length)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
                psVar9 = cmTarget::GetName_abi_cxx11_(local_358->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" is\nimplied to be ",0x13);
                pcVar3 = local_f8;
                if (local_f8 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar11 = strlen(local_f8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar3,sVar11);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,
                           " because it was used to determine the link libraries\nalready. The INTERFACE_"
                           ,0x4c);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(p->_M_dataplus)._M_p,p->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," property on\ndependency \"",0x19);
                psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"\" is in conflict.\n",0x12);
                std::__cxx11::stringbuf::str();
                cmSystemTools::Error(&local_330);
                goto LAB_00358c9e;
              }
              iVar5 = 3;
              std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              goto LAB_00358ce4;
            }
            iVar5 = 3;
          }
        }
        else if (_Var7._M_current == pbVar4) {
LAB_0035874f:
          iVar5 = 3;
        }
        else {
          consistentProperty((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_3a0,__return_storage_ptr__,&local_2e8,t);
          std::__cxx11::string::_M_append((char *)&local_378,(ulong)local_350);
          sVar11 = __return_storage_ptr__->_M_string_length;
          bVar14 = true;
          if (sVar11 == local_3a0._16_8_) {
            if (sVar11 == 0) {
              bVar14 = false;
            }
            else {
              iVar5 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(void *)local_3a0._8_8_,sVar11
                          );
              bVar14 = iVar5 != 0;
            }
          }
          compatibilityAgree_abi_cxx11_((string *)local_270,t,bVar14);
          std::__cxx11::string::_M_append((char *)&local_378,local_270._0_8_);
          if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
            operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
          }
          if (local_3a0[0] == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_270,"Property ",9);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_270,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10," on target \"",0xc);
            psVar9 = cmTarget::GetName_abi_cxx11_(local_358->Target);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"\" does\nnot match the INTERFACE_",0x1f);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(p->_M_dataplus)._M_p,p->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," property requirement\nof dependency \"",0x25);
            psVar9 = cmTarget::GetName_abi_cxx11_(pcVar2->Target);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar10,(psVar9->_M_dataplus)._M_p,psVar9->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\".\n",3);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Error(&local_330);
LAB_00358c9e:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
            std::ios_base::~ios_base(local_200);
            iVar5 = 2;
          }
          else {
            iVar5 = 3;
            std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
          }
LAB_00358ce4:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._8_8_ != &local_388) {
            operator_delete((void *)local_3a0._8_8_,local_388._M_allocated_capacity + 1);
          }
        }
        if (local_350 != &local_340) {
          operator_delete(local_350,CONCAT71(uStack_33f,local_340) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
          operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_e0);
      } while (((iVar5 == 3) || (iVar5 == 0)) &&
              (pcVar12 = (cmGeneratorExpressionInterpreter *)
                         &(local_310->GeneratorExpression).Backtrace.TopEntry.
                          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount, pcVar12 != local_f0));
    }
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    local_2b0 = &local_2a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b0,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
    pcVar2 = local_358;
    if (local_2b0 == &local_2a0) {
      uStack_258 = uStack_298;
      local_270._0_8_ = local_270 + 0x10;
    }
    else {
      local_270._0_8_ = local_2b0;
    }
    uStack_25f = uStack_29f;
    local_270[0x10] = local_2a0;
    local_270._8_8_ = local_2a8;
    local_2a8 = 0;
    local_2a0 = '\0';
    local_2b0 = &local_2a0;
    compatibilityType_abi_cxx11_((string *)local_3a0,t);
    cmGeneratorTarget::ReportPropertyOrigin
              (pcVar2,p,(string *)local_270,&local_378,(string *)local_3a0);
    if ((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]) != local_3a0 + 0x10) {
      operator_delete((undefined1 *)CONCAT71(local_3a0._1_7_,local_3a0[0]),local_3a0._16_8_ + 1);
    }
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,stack0xfffffffffffffda0 + 1);
    }
    if (local_2b0 != &local_2a0) {
      operator_delete(local_2b0,CONCAT71(uStack_29f,local_2a0) + 1);
    }
    if (local_3a8 != (cmGeneratorExpressionInterpreter *)0x0) {
      std::default_delete<cmGeneratorExpressionInterpreter>::operator()
                ((default_delete<cmGeneratorExpressionInterpreter> *)&local_3a8,local_3a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                                 const std::string& p,
                                                 const std::string& config,
                                                 const char* defaultValue,
                                                 CompatibleType t,
                                                 PropertyType* /*unused*/)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);

  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
    std::find(headPropKeys.begin(), headPropKeys.end(), p) !=
    headPropKeys.end();

  const bool impliedByUse = tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if (deps.empty()) {
    return propContent;
  }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet) {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
  } else if (impliedByUse) {
    report += "\" property is implied by use.\n";
  } else {
    report += "\" property not set.\n";
  }

  std::string interfaceProperty = "INTERFACE_" + p;
  std::unique_ptr<cmGeneratorExpressionInterpreter> genexInterpreter(
    p == "POSITION_INDEPENDENT_CODE" ? new cmGeneratorExpressionInterpreter(
                                         tgt->GetLocalGenerator(), config, tgt)
                                     : nullptr);

  for (cmGeneratorTarget const* theTarget : deps) {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet = std::find(propKeys.begin(), propKeys.end(),
                                      interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent = getTypedProperty<PropertyType>(
      theTarget, interfaceProperty, genexInterpreter.get());

    std::string reportEntry;
    if (ifaceIsSet) {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
    }

    if (explicitlySet) {
      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" does\nnot match the "
               "INTERFACE_"
            << p
            << " property requirement\nof "
               "dependency \""
            << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Explicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (impliedByUse) {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "Property " << p << " on target \"" << tgt->GetName()
            << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_"
            << p << " property on\ndependency \"" << theTarget->GetName()
            << "\" is in conflict.\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      // Implicitly set on target and not set in iface. Can't disagree.
      continue;
    }
    if (ifaceIsSet) {
      if (propInitialized) {
        std::pair<bool, PropertyType> consistent =
          consistentProperty(propContent, ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first) {
          std::ostringstream e;
          e << "The INTERFACE_" << p << " property of \""
            << theTarget->GetName() << "\" does\nnot agree with the value of "
            << p << " already determined\nfor \"" << tgt->GetName() << "\".\n";
          cmSystemTools::Error(e.str());
          break;
        }
        propContent = consistent.second;
        continue;
      }
      report += reportEntry + "(Interface set)\n";
      propContent = ifacePropContent;
      propInitialized = true;
    } else {
      // Not set. Nothing to agree on.
      continue;
    }
  }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}